

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  pointer pcVar6;
  UnitTestImpl *pUVar7;
  _func_int **pp_Var8;
  undefined1 name_00 [8];
  const_iterator cVar9;
  long *plVar10;
  TestFactoryBase *factory;
  long *plVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  undefined1 local_438 [8];
  char kMissingInstantiation [378];
  char kMissingTestCase [348];
  size_type *local_150;
  string message;
  _func_int **local_128;
  undefined1 local_120;
  uint7 uStack_11f;
  _func_int **pp_Stack_118;
  TestFactoryBase *local_110;
  _func_int **local_108;
  TestFactoryBase local_100;
  _func_int **pp_Stack_f8;
  int local_f0;
  CodeLocation local_e8;
  undefined1 local_c0 [8];
  string full_name;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  TestFactoryBase *local_60;
  undefined8 local_58;
  TestFactoryBase local_50;
  _func_int **pp_Stack_48;
  int local_40;
  allocator local_31;
  
  UnitTest::GetInstance();
  pUVar7 = UnitTest::GetInstance::instance.impl_;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t
                 ,name);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &(pUVar7->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header) {
    memcpy(local_438,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy(kMissingInstantiation + 0x178,
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "Parameterized test suite ",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)local_c0);
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_90 = *plVar11;
      lStack_88 = plVar10[3];
      full_name.field_2._8_8_ = &local_90;
    }
    else {
      local_90 = *plVar11;
      full_name.field_2._8_8_ = (long *)*plVar10;
    }
    lVar4 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append(full_name.field_2._M_local_buf + 8);
    paVar2 = &local_e8.file.field_2;
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_e8.file.field_2._M_allocated_capacity = *psVar12;
      local_e8.file.field_2._8_8_ = plVar10[3];
      local_e8.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_e8.file.field_2._M_allocated_capacity = *psVar12;
      local_e8.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_e8.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_e8,(ulong)(name->_M_dataplus)._M_p);
    paVar1 = &local_80.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar13) {
      local_80.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_80.field_2._8_8_ = plVar10[3];
      local_80._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_80.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_80._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_80._M_string_length = plVar10[1];
    *plVar10 = (long)paVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_150 = &message._M_string_length;
    psVar12 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar12) {
      message._M_string_length = *psVar12;
      message.field_2._M_allocated_capacity = plVar10[3];
    }
    else {
      message._M_string_length = *psVar12;
      local_150 = (size_type *)*plVar10;
    }
    message._M_dataplus._M_p = (pointer)plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8.file._M_dataplus._M_p);
    }
    if ((long *)full_name.field_2._8_8_ != &local_90) {
      operator_delete((void *)full_name.field_2._8_8_);
    }
    if (local_c0 != (undefined1  [8])&full_name._M_string_length) {
      operator_delete((void *)local_c0);
    }
    std::operator+(&local_80,"UninstantiatedParameterizedTestSuite<",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar12 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar12) {
      full_name._M_string_length = *psVar12;
      full_name.field_2._M_allocated_capacity = plVar10[3];
      local_c0 = (undefined1  [8])&full_name._M_string_length;
    }
    else {
      full_name._M_string_length = *psVar12;
      local_c0 = (undefined1  [8])*plVar10;
    }
    full_name._M_dataplus._M_p = (pointer)plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    name_00 = local_c0;
    pcVar5 = (location->file)._M_dataplus._M_p;
    iVar3 = location->line;
    message.field_2._8_8_ = &local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&message.field_2 + 8),local_150,
               message._M_dataplus._M_p + (long)local_150);
    pcVar6 = (location->file)._M_dataplus._M_p;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar6,pcVar6 + (location->file)._M_string_length);
    local_f0 = location->line;
    std::__cxx11::string::string((string *)(full_name.field_2._M_local_buf + 8),pcVar5,&local_31);
    local_e8.file._M_dataplus._M_p = (pointer)&local_e8.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,full_name.field_2._8_8_,lVar4 + full_name.field_2._8_8_);
    local_e8.line = iVar3;
    factory = (TestFactoryBase *)operator_new(0x50);
    pp_Var8 = local_108;
    if ((undefined1 *)message.field_2._8_8_ == &local_120) {
      message.field_2._8_8_ = &local_80.field_2;
      local_80.field_2._8_8_ = pp_Stack_118;
    }
    local_80.field_2._M_allocated_capacity._1_7_ = uStack_11f;
    local_80.field_2._M_local_buf[0] = local_120;
    local_120 = 0;
    if (local_110 == &local_100) {
      pp_Stack_48 = pp_Stack_f8;
      local_110 = &local_50;
    }
    local_50._vptr_TestFactoryBase._1_7_ = local_100._vptr_TestFactoryBase._1_7_;
    local_50._vptr_TestFactoryBase._0_1_ = local_100._vptr_TestFactoryBase._0_1_;
    local_108 = (_func_int **)0x0;
    local_100._vptr_TestFactoryBase._0_1_ = 0;
    local_40 = local_f0;
    factory->_vptr_TestFactoryBase =
         (_func_int **)
         (
         _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEbE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
         + 0x10);
    factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    if ((pointer)message.field_2._8_8_ == local_80._M_dataplus._M_p) {
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_80.field_2._M_allocated_capacity;
      factory[4]._vptr_TestFactoryBase = (_func_int **)local_80.field_2._8_8_;
    }
    else {
      factory[1]._vptr_TestFactoryBase = (_func_int **)message.field_2._8_8_;
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_80.field_2._M_allocated_capacity;
    }
    factory[2]._vptr_TestFactoryBase = local_128;
    local_80._M_string_length = 0;
    local_80.field_2._M_allocated_capacity = (ulong)uStack_11f << 8;
    factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
    if (local_110 == &local_50) {
      factory[7]._vptr_TestFactoryBase = local_50._vptr_TestFactoryBase;
      factory[8]._vptr_TestFactoryBase = pp_Stack_48;
    }
    else {
      factory[5]._vptr_TestFactoryBase = (_func_int **)local_110;
      factory[7]._vptr_TestFactoryBase = local_50._vptr_TestFactoryBase;
    }
    factory[6]._vptr_TestFactoryBase = pp_Var8;
    local_58 = 0;
    local_50._vptr_TestFactoryBase =
         (_func_int **)((ulong)local_100._vptr_TestFactoryBase._1_7_ << 8);
    *(int *)&factory[9]._vptr_TestFactoryBase = local_f0;
    message.field_2._8_8_ = &local_120;
    local_110 = &local_100;
    local_60 = &local_50;
    MakeAndRegisterTestInfo
              ("GoogleTestVerification",(char *)name_00,(char *)0x0,(char *)0x0,&local_e8,
               &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
               (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.file._M_dataplus._M_p != &local_e8.file.field_2) {
      operator_delete(local_e8.file._M_dataplus._M_p);
    }
    if ((long *)full_name.field_2._8_8_ != &local_90) {
      operator_delete((void *)full_name.field_2._8_8_);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if ((undefined1 *)message.field_2._8_8_ != &local_120) {
      operator_delete((void *)message.field_2._8_8_);
    }
    if (local_c0 != (undefined1  [8])&full_name._M_string_length) {
      operator_delete((void *)local_c0);
    }
    if (local_150 != &message._M_string_length) {
      operator_delete(local_150);
    }
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" + name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}